

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_exception_what_method_decl
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool external)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined3 in_register_00000009;
  long lVar3;
  char *pcVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"const char* ",0xc);
  if (CONCAT31(in_register_00000009,external) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"what() const noexcept",0x15);
    pcVar4 = " override";
    lVar3 = 9;
  }
  else {
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)CONCAT44(extraout_var,iVar1),
                        ((undefined8 *)CONCAT44(extraout_var,iVar1))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"::",2);
    pcVar4 = "what() const noexcept";
    lVar3 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,lVar3);
  return;
}

Assistant:

void t_cpp_generator::generate_exception_what_method_decl(std::ostream& out,
                                                          t_struct* tstruct,
                                                          bool external) {
  out << "const char* ";
  if (external) {
    out << tstruct->get_name() << "::";
  }
  out << "what() const noexcept";
  if(!external)
    out << " override";
}